

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TER.cpp
# Opt level: O0

string * __thiscall
jbcoin::transToken_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,TER code)

{
  bool bVar1;
  allocator local_65 [13];
  undefined1 local_58 [8];
  string text;
  string token;
  TER code_local;
  
  std::__cxx11::string::string((string *)(text.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  bVar1 = transResultInfo((TER)this,(string *)(text.field_2._M_local_buf + 8),(string *)local_58);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(text.field_2._M_local_buf + 8));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-",local_65);
    std::allocator<char>::~allocator((allocator<char> *)local_65);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(text.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string transToken (TER code)
{
    std::string token;
    std::string text;

    return transResultInfo (code, token, text) ? token : "-";
}